

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_div_2(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *pmVar2;
  mp_digit *pmVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  iVar5 = a->used;
  if (b->alloc < iVar5) {
    iVar5 = mp_grow(b,iVar5);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = a->used;
  }
  iVar1 = b->used;
  b->used = iVar5;
  lVar6 = (long)iVar5;
  pmVar2 = b->dp;
  pmVar3 = a->dp;
  uVar8 = 0;
  for (lVar7 = 0; 0 < iVar5 + (int)lVar7; lVar7 = lVar7 + -1) {
    uVar4 = pmVar3[lVar6 + lVar7 + -1];
    pmVar2[lVar6 + lVar7 + -1] = uVar8 << 0x3b | uVar4 >> 1;
    uVar8 = (ulong)((uint)uVar4 & 1);
  }
  for (; (int)lVar6 < iVar1; lVar6 = lVar6 + 1) {
    pmVar2[lVar6] = 0;
  }
  b->sign = a->sign;
  mp_clamp(b);
  return 0;
}

Assistant:

int mp_div_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* copy */
  if (b->alloc < a->used) {
    if ((res = mp_grow (b, a->used)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;
  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* source alias */
    tmpa = a->dp + b->used - 1;

    /* dest alias */
    tmpb = b->dp + b->used - 1;

    /* carry */
    r = 0;
    for (x = b->used - 1; x >= 0; x--) {
      /* get the carry for the next iteration */
      rr = *tmpa & 1;

      /* shift the current digit, add in carry and store */
      *tmpb-- = (*tmpa-- >> 1) | (r << (DIGIT_BIT - 1));

      /* forward carry to next iteration */
      r = rr;
    }

    /* zero excess digits */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  mp_clamp (b);
  return MP_OKAY;
}